

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::CAPIExternalCommand::processDependencyInfoDiscoveredDependencies(llbuild::
buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,std::__cxx11
::string)::DepsActions::actOnInput(llvm::StringRef_(void *this,StringRef path)

{
  BuildSystemDelegate *pBVar1;
  size_t in_RCX;
  StringRef path_00;
  BuildKey local_60;
  KeyType local_40;
  void *local_20;
  DepsActions *this_local;
  StringRef path_local;
  
  path_00.Data = (char *)path.Length;
  this_local = (DepsActions *)path.Data;
  path_00.Length = in_RCX;
  local_20 = this;
  path_local.Data = path_00.Data;
  llbuild::buildsystem::BuildKey::makeNode(&local_60,(BuildKey *)this_local,path_00);
  llbuild::buildsystem::BuildKey::toData(&local_40,&local_60);
  llbuild::core::TaskInterface::discoveredDependency((TaskInterface *)((long)this + 0x10),&local_40)
  ;
  llbuild::core::KeyType::~KeyType(&local_40);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_60);
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
  (*pBVar1->_vptr_BuildSystemDelegate[0xf])
            (pBVar1,*(undefined8 *)((long)this + 0x20),this_local,path_local.Data,0);
  return;
}

Assistant:

virtual void actOnInput(StringRef path) override {
        ti.discoveredDependency(BuildKey::makeNode(path).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, path, DiscoveredDependencyKind::Input);
      }